

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O1

void * DIR_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  PHYSFS_ErrorCode errcode;
  PHYSFS_Stat st;
  PHYSFS_Stat PStack_48;
  
  sVar2 = strlen(name);
  if (io != (PHYSFS_Io *)0x0) {
    __assert_fail("io == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_dir.c"
                  ,0x33,"void *DIR_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  iVar1 = __PHYSFS_platformStat(name,&PStack_48);
  if (iVar1 != 0) {
    if (PStack_48.filetype == PHYSFS_FILETYPE_DIRECTORY) {
      *claimed = 1;
      __dest = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar2 + 2);
      if (__dest != (char *)0x0) {
        strcpy(__dest,name);
        if (__dest[sVar2 - 1] == '/') {
          return __dest;
        }
        (__dest + sVar2)[0] = '/';
        (__dest + sVar2)[1] = '\0';
        return __dest;
      }
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    else {
      errcode = PHYSFS_ERR_UNSUPPORTED;
    }
    PHYSFS_setErrorCode(errcode);
  }
  return (void *)0x0;
}

Assistant:

static void *DIR_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_Stat st;
    const char dirsep = __PHYSFS_platformDirSeparator;
    char *retval = NULL;
    const size_t namelen = strlen(name);
    const size_t seplen = 1;

    assert(io == NULL);  /* shouldn't create an Io for these. */
    BAIL_IF_ERRPASS(!__PHYSFS_platformStat(name, &st), NULL);
    if (st.filetype != PHYSFS_FILETYPE_DIRECTORY)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;
    retval = allocator.Malloc(namelen + seplen + 1);
    BAIL_IF(retval == NULL, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    strcpy(retval, name);

    /* make sure there's a dir separator at the end of the string */
    if (retval[namelen - 1] != dirsep)
    {
        retval[namelen] = dirsep;
        retval[namelen + 1] = '\0';
    } /* if */

    return retval;
}